

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<bool>::FindHelper
          (KeyMapBase<bool> *this,ViewType k,TreeIterator *it)

{
  TableEntryPtr entry;
  map_index_t b;
  NodeBase *pNVar1;
  NodeAndBucket NVar2;
  
  b = BucketNumber(this,k);
  entry = (this->super_UntypedMapBase).table_[b];
  if ((entry & 1) == 0 && entry != 0) {
    pNVar1 = TableEntryToNode(entry);
    do {
      if ((ViewType)(*(byte *)&pNVar1[1].next & 1) == k) goto LAB_0027014c;
      pNVar1 = pNVar1->next;
    } while (pNVar1 != (NodeBase *)0x0);
  }
  else if ((entry & 1) != 0) {
    NVar2 = UntypedMapBase::FindFromTree
                      (&this->super_UntypedMapBase,b,(VariantKey)(ZEXT116(k) << 0x40),it);
    pNVar1 = NVar2.node;
    b = NVar2.bucket;
    goto LAB_0027014c;
  }
  pNVar1 = (NodeBase *)0x0;
LAB_0027014c:
  NVar2.bucket = b;
  NVar2.node = pNVar1;
  NVar2._12_4_ = 0;
  return NVar2;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }